

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionTree.cpp
# Opt level: O3

ExprBase *
CreateFunctionDefinition
          (ExpressionContext *ctx,SynBase *source,bool prototype,bool coroutine,TypeBase *parentType
          ,bool accessor,TypeBase *returnType,bool isOperator,SynIdentifier *name,
          IntrusiveList<SynIdentifier> aliases,IntrusiveList<SynFunctionArgument> arguments,
          IntrusiveList<SynBase> expressions,FunctionData *genericProto,TypeFunction *instance,
          IntrusiveList<MatchData> matches)

{
  Allocator *pAVar1;
  long lVar2;
  ArgumentData *pAVar3;
  char *pcVar4;
  FunctionData **ppFVar5;
  TypeClass *classType;
  ExprBase **ppEVar6;
  undefined1 auVar7 [16];
  undefined8 uVar8;
  IntrusiveList<MatchData> generics_00;
  bool bVar9;
  bool bVar10;
  uint uVar11;
  int iVar12;
  SynIdentifier *source_00;
  TypeBase *pTVar13;
  TypeGenericAlias *pTVar14;
  undefined4 extraout_var;
  TypeRef *pTVar16;
  TypeFunction *pTVar17;
  IdentifierLookupResult *pIVar18;
  SynIdentifier *pSVar19;
  FunctionData *this;
  FunctionData *pFVar20;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  TypeBase *pTVar21;
  undefined4 extraout_var_04;
  size_t sVar22;
  AliasData *alias;
  SynBase *pSVar23;
  ExprVariableDefinition *pEVar24;
  undefined4 extraout_var_06;
  VariableData *this_00;
  TypeClass *pTVar25;
  ExprBase *pEVar26;
  undefined4 extraout_var_08;
  _func_int **pp_Var27;
  SynBase *pSVar28;
  undefined4 extraout_var_10;
  undefined4 extraout_var_11;
  undefined4 extraout_var_12;
  VariableHandle *pVVar29;
  undefined4 extraout_var_14;
  ExprVariableDefinition *pEVar30;
  TypeBase *pTVar31;
  MatchData *pMVar32;
  long lVar33;
  char *pcVar34;
  ulong uVar35;
  int iVar36;
  ExpressionContext *this_01;
  ScopeData *pSVar37;
  MatchData *pMVar38;
  undefined8 *puVar39;
  uint uVar40;
  SynIdentifier *pSVar41;
  IntrusiveList<SynFunctionArgument> arguments_00;
  ArrayView<ArgumentData> arguments_01;
  ArrayView<ArgumentData> arguments_02;
  InplaceStr IVar42;
  ArrayView<ArgumentData> argData_00;
  InplaceStr parentName;
  IntrusiveList<ExprBase> code;
  IntrusiveList<MatchData> generics;
  TraceScope traceScope;
  IntrusiveList<ExprVariableDefinition> variables;
  SmallArray<ArgumentData,_8U> argData;
  VariableData *local_298;
  ScopeData *local_280;
  char *local_278;
  ExprBase *local_268;
  FunctionLookupChain local_258;
  TypeRef *local_240;
  undefined8 local_238;
  InplaceStr *local_230;
  IntrusiveList<ExprBase> local_228;
  FunctionLookupChain local_218;
  IntrusiveList<MatchData> local_1f8;
  TraceScope local_1e8;
  IntrusiveList<ExprVariableDefinition> local_1d8;
  undefined1 local_1c8 [24];
  undefined8 auStack_1b0 [47];
  Allocator *local_38;
  MatchData *pMVar15;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_05;
  undefined4 extraout_var_07;
  undefined4 extraout_var_09;
  undefined4 extraout_var_13;
  
  source_00 = name;
  if ((name->super_SynBase).begin == (Lexeme *)0x0) {
    source_00 = (SynIdentifier *)source;
  }
  bVar9 = RestoreParentTypeScope(ctx,source,parentType);
  pTVar21 = ctx->scope->ownerType;
  if (pTVar21 == (TypeBase *)0x0) {
    pTVar21 = parentType;
  }
  if (parentType != (TypeBase *)0x0) {
    pTVar21 = parentType;
  }
  if (pTVar21 != (TypeBase *)0x0 && coroutine) {
    pcVar34 = "ERROR: coroutine cannot be a member function";
    pSVar19 = source_00;
LAB_00164a1c:
    anon_unknown.dwarf_9c70f::Stop(ctx,&pSVar19->super_SynBase,pcVar34);
  }
  local_1f8.head = (MatchData *)0x0;
  local_1f8.tail = (MatchData *)0x0;
  if (aliases.head != (SynIdentifier *)0x0) {
    pSVar19 = aliases.head;
    do {
      uVar11 = NULLC::GetStringHash((pSVar19->name).begin,(pSVar19->name).end);
      pTVar13 = anon_unknown.dwarf_9c70f::LookupTypeByName
                          ((anon_unknown_dwarf_9c70f *)ctx->scope,
                           (ExpressionContext *)ctx->lookupLocation,uVar11);
      if (pTVar13 != (TypeBase *)0x0) {
        pcVar34 = "ERROR: there is already a type with the same name";
        goto LAB_00164a1c;
      }
      pMVar15 = matches.head;
      pSVar41 = aliases.head;
      if (aliases.head != pSVar19 && aliases.head != (SynIdentifier *)0x0) {
        do {
          bVar10 = InplaceStr::operator==(&pSVar41->name,&pSVar19->name);
          if (bVar10) {
            pcVar34 = "ERROR: there is already an alias with the same name";
            goto LAB_00164a1c;
          }
          pSVar41 = (SynIdentifier *)(pSVar41->super_SynBase).next;
        } while (((pSVar41 != (SynIdentifier *)0x0) && ((pSVar41->super_SynBase).typeID == 4)) &&
                (pSVar41 != pSVar19));
      }
      for (; pMVar15 != (MatchData *)0x0; pMVar15 = pMVar15->next) {
        bVar10 = InplaceStr::operator==(&pSVar19->name,&pMVar15->name->name);
        if (bVar10) {
          pTVar14 = (TypeGenericAlias *)pMVar15->type;
          if (pTVar14 != (TypeGenericAlias *)0x0) goto LAB_001634e6;
          break;
        }
      }
      pTVar14 = ExpressionContext::GetGenericAliasType(ctx,pSVar19);
LAB_001634e6:
      iVar12 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x20);
      pMVar15 = (MatchData *)CONCAT44(extraout_var,iVar12);
      pMVar15->name = pSVar19;
      pMVar15->type = &pTVar14->super_TypeBase;
      pMVar15->next = (MatchData *)0x0;
      pMVar15->listed = false;
      IntrusiveList<MatchData>::push_back(&local_1f8,pMVar15);
      pSVar19 = (SynIdentifier *)(pSVar19->super_SynBase).next;
    } while ((pSVar19 != (SynIdentifier *)0x0) && ((pSVar19->super_SynBase).typeID == 4));
  }
  local_280 = (ScopeData *)&ctx->scope;
  pAVar1 = ctx->allocator;
  lVar33 = 0x20;
  do {
    *(undefined8 *)((long)&local_1d8.head + lVar33) = 0;
    local_1c8[lVar33 + -8] = 0;
    *(undefined8 *)(local_1c8 + lVar33) = 0;
    *(undefined8 *)(local_1c8 + lVar33 + 8) = 0;
    *(undefined8 *)(local_1c8 + lVar33 + 0x10) = 0;
    *(undefined8 *)((long)auStack_1b0 + lVar33) = 0;
    lVar33 = lVar33 + 0x30;
  } while (lVar33 != 0x1a0);
  local_1c8._0_8_ = local_1c8 + 0x10;
  local_1c8._8_4_ = 0;
  local_1c8._12_4_ = 8;
  arguments_00.tail = (SynFunctionArgument *)local_1c8._0_8_;
  arguments_00.head = arguments.head;
  local_38 = pAVar1;
  AnalyzeFunctionDefinitionArguments
            (ctx,arguments_00,pTVar21,instance,(SmallArray<ArgumentData,_8U> *)local_1c8);
  if (isOperator) {
    argData_00.count = local_1c8._8_4_;
    argData_00.data = (ArgumentData *)local_1c8._0_8_;
    argData_00._12_4_ = 0;
    CheckOperatorName(ctx,source,name->name,argData_00);
  }
  if ((accessor) && (bVar10 = InplaceStr::operator==(&name->name,&pTVar21->name), bVar10)) {
    anon_unknown.dwarf_9c70f::Stop
              (ctx,&source_00->super_SynBase,"ERROR: name \'%.*s\' is already taken for a type",
               (ulong)(uint)(*(int *)&(name->name).end - (int)(name->name).begin));
  }
  if ((name->name).begin == (name->name).end) {
    IVar42 = GetTemporaryFunctionName(ctx);
  }
  else {
    IVar42 = GetFunctionNameInScope(ctx,ctx->scope,pTVar21,name->name,isOperator,accessor);
  }
  if ((CreateFunctionDefinition(ExpressionContext&,SynBase*,bool,bool,TypeBase*,bool,TypeBase*,bool,SynIdentifier*,IntrusiveList<SynIdentifier>,IntrusiveList<SynFunctionArgument>,IntrusiveList<SynBase>,FunctionData*,TypeFunction*,IntrusiveList<MatchData>)
       ::token == '\0') &&
     (iVar12 = __cxa_guard_acquire(&CreateFunctionDefinition(ExpressionContext&,SynBase*,bool,bool,TypeBase*,bool,TypeBase*,bool,SynIdentifier*,IntrusiveList<SynIdentifier>,IntrusiveList<SynFunctionArgument>,IntrusiveList<SynBase>,FunctionData*,TypeFunction*,IntrusiveList<MatchData>)
                                    ::token), iVar12 != 0)) {
    CreateFunctionDefinition::token = NULLC::TraceGetToken("analyze","CreateFunctionDefinition");
    __cxa_guard_release(&CreateFunctionDefinition(ExpressionContext&,SynBase*,bool,bool,TypeBase*,bool,TypeBase*,bool,SynIdentifier*,IntrusiveList<SynIdentifier>,IntrusiveList<SynFunctionArgument>,IntrusiveList<SynBase>,FunctionData*,TypeFunction*,IntrusiveList<MatchData>)
                         ::token);
  }
  local_278 = IVar42.end;
  local_298 = (VariableData *)IVar42.begin;
  local_238 = (TypeBase *)CONCAT44(local_238._4_4_,(uint)accessor);
  NULLC::TraceScope::TraceScope(&local_1e8,CreateFunctionDefinition::token);
  lVar33 = NULLC::traceContext;
  iVar12 = (int)((long)local_278 - (long)local_298);
  if (iVar12 != 0) {
    uVar40 = iVar12 + 1;
    uVar11 = *(uint *)(NULLC::traceContext + 0x264);
    if ((uVar11 <= *(int *)(NULLC::traceContext + 0x260) + uVar40) ||
       (*(int *)(NULLC::traceContext + 0x270) == *(int *)(NULLC::traceContext + 0x274))) {
      NULLC::TraceDump();
      uVar11 = *(uint *)(lVar33 + 0x264);
    }
    if (uVar11 <= uVar40) {
      __assert_fail("count + 1 < context.labels.max",
                    "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/Trace.h"
                    ,0x142,"void NULLC::TraceLabel(const char *, const char *)");
    }
    uVar11 = *(uint *)(lVar33 + 0x260);
    memcpy((void *)((ulong)uVar11 + *(long *)(lVar33 + 0x268)),local_298,
           (long)local_278 - (long)local_298 & 0xffffffff);
    *(undefined1 *)(*(long *)(lVar33 + 0x268) + (ulong)(uint)(*(int *)(lVar33 + 0x260) + iVar12)) =
         0;
    *(int *)(lVar33 + 0x260) = *(int *)(lVar33 + 0x260) + uVar40;
    lVar2 = *(long *)(lVar33 + 0x278);
    uVar40 = *(uint *)(lVar33 + 0x270);
    *(uint *)(lVar33 + 0x270) = uVar40 + 1;
    *(uint *)(lVar2 + (ulong)uVar40 * 8) = uVar11 * 4 + 2;
    *(undefined4 *)(lVar2 + 4 + (ulong)uVar40 * 8) = 0;
  }
  if (pTVar21 == (TypeBase *)0x0) {
    if ((coroutine) ||
       ((ctx->scope != ctx->globalScope && (ctx->scope->ownerNamespace == (NamespaceData *)0x0)))) {
      pTVar13 = CreateFunctionContextType(ctx,source,IVar42);
    }
    else {
      pTVar13 = ctx->typeVoid;
    }
    pTVar16 = ExpressionContext::GetReferenceType(ctx,pTVar13);
  }
  else {
    pTVar16 = ExpressionContext::GetReferenceType(ctx,pTVar21);
  }
  if ((returnType != (TypeBase *)0x0) && (returnType->typeID == 0)) {
    if (bVar9) {
      ExpressionContext::PopScope(ctx,SCOPE_TYPE,true);
    }
    iVar12 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x68);
    pEVar26 = (ExprBase *)CONCAT44(extraout_var_02,iVar12);
    pTVar21 = &ExpressionContext::GetErrorType(ctx)->super_TypeBase;
LAB_00163b08:
    pEVar26->typeID = 0;
    pEVar26->source = source;
    pEVar26->type = pTVar21;
    pEVar26->next = (ExprBase *)0x0;
    pEVar26->listed = false;
    pEVar26->_vptr_ExprBase = (_func_int **)&PTR__ExprError_00223b38;
    pEVar26[2]._vptr_ExprBase = (_func_int **)0x0;
    pEVar26[1]._vptr_ExprBase = (_func_int **)&pEVar26[1].source;
    *(undefined8 *)&pEVar26[1].typeID = 0x400000000;
    goto LAB_00164942;
  }
  arguments_01.count = local_1c8._8_4_;
  arguments_01.data = (ArgumentData *)local_1c8._0_8_;
  local_240 = pTVar16;
  if ((ulong)(uint)local_1c8._8_4_ != 0) {
    lVar33 = 0;
    do {
      lVar2 = *(long *)((long)&((SynBase *)local_1c8._0_8_)->end + lVar33);
      if ((lVar2 != 0) && (*(int *)(lVar2 + 8) == 0)) {
        if (bVar9) {
          ExpressionContext::PopScope(ctx,SCOPE_TYPE,true);
        }
        iVar12 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x68);
        pEVar26 = (ExprBase *)CONCAT44(extraout_var_03,iVar12);
        pTVar21 = &ExpressionContext::GetErrorType(ctx)->super_TypeBase;
        goto LAB_00163b08;
      }
      lVar33 = lVar33 + 0x30;
    } while ((ulong)(uint)local_1c8._8_4_ * 0x30 != lVar33);
  }
  arguments_01._12_4_ = 0;
  pTVar17 = ExpressionContext::GetFunctionType(ctx,source,returnType,arguments_01);
  if ((instance != (TypeFunction *)0x0) && (pTVar17 != instance)) {
    __assert_fail("functionType == instance",
                  "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/ExpressionTree.cpp"
                  ,0x236c,
                  "ExprBase *CreateFunctionDefinition(ExpressionContext &, SynBase *, bool, bool, TypeBase *, bool, TypeBase *, bool, SynIdentifier *, IntrusiveList<SynIdentifier>, IntrusiveList<SynFunctionArgument>, IntrusiveList<SynBase>, FunctionData *, TypeFunction *, IntrusiveList<MatchData>)"
                 );
  }
  uVar11 = NULLC::GetStringHash((char *)local_298,local_278);
  pIVar18 = anon_unknown.dwarf_9c70f::LookupObjectByName(ctx,uVar11);
  if (((pIVar18 != (IdentifierLookupResult *)0x0) && (pIVar18->variable != (VariableData *)0x0)) &&
     (pIVar18->variable->scope == *(ScopeData **)local_280)) {
    anon_unknown.dwarf_9c70f::Stop
              (ctx,&source_00->super_SynBase,
               "ERROR: name \'%.*s\' is already taken for a variable in current scope",
               (ulong)(uint)(*(int *)&(name->name).end - (int)(name->name).begin));
  }
  if ((pTVar21 != (TypeBase *)0x0) && (pTVar21->typeID == 0x18)) {
    local_258.node.node = (Node *)"";
    local_258.node.start = (Node *)"finalize";
    bVar10 = InplaceStr::operator==(&name->name,(InplaceStr *)&local_258);
    if (bVar10) {
      *(undefined1 *)((long)&pTVar21[3]._vptr_TypeBase + 2) = 1;
    }
  }
  iVar12 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x50);
  pSVar19 = (SynIdentifier *)CONCAT44(extraout_var_00,iVar12);
  SynBase::SynBase((SynBase *)pSVar19,4,(name->super_SynBase).begin,(name->super_SynBase).end);
  (pSVar19->super_SynBase)._vptr_SynBase = (_func_int **)&PTR__SynBase_002222c0;
  pSVar19->name = IVar42;
  local_230 = &name->name;
  iVar12 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x338);
  this = (FunctionData *)CONCAT44(extraout_var_01,iVar12);
  uVar11 = ctx->uniqueFunctionId;
  ctx->uniqueFunctionId = uVar11 + 1;
  pcVar34 = (char *)(ulong)coroutine;
  generics_00.tail = local_1f8.tail;
  generics_00.head = local_1f8.head;
  FunctionData::FunctionData
            (this,ctx->allocator,source,ctx->scope,coroutine,SUB81(local_238,0),isOperator,pTVar17,
             &local_240->super_TypeBase,pSVar19,generics_00,uVar11);
  (this->aliases).head = matches.head;
  (this->aliases).tail = matches.tail;
  if (local_1c8._8_4_ != 0) {
    lVar33 = 0;
    uVar35 = 0;
    do {
      puVar39 = (undefined8 *)((long)&((SynBase *)local_1c8._0_8_)->_vptr_SynBase + lVar33);
      uVar11 = (this->arguments).count;
      if (uVar11 == (this->arguments).max) {
        SmallArray<ArgumentData,_4U>::grow(&this->arguments,uVar11);
      }
      pAVar3 = (this->arguments).data;
      if (pAVar3 == (ArgumentData *)0x0) {
        pcVar34 = "void SmallArray<ArgumentData, 4>::push_back(const T &) [T = ArgumentData, N = 4]"
        ;
        goto LAB_00164a38;
      }
      uVar11 = (this->arguments).count;
      (this->arguments).count = uVar11 + 1;
      pSVar23 = (SynBase *)*puVar39;
      uVar8 = puVar39[1];
      pSVar19 = (SynIdentifier *)puVar39[2];
      pTVar13 = (TypeBase *)puVar39[3];
      pFVar20 = (FunctionData *)puVar39[5];
      pAVar3[uVar11].value = (ExprBase *)puVar39[4];
      (&pAVar3[uVar11].value)[1] = (ExprBase *)pFVar20;
      pAVar3[uVar11].name = pSVar19;
      (&pAVar3[uVar11].name)[1] = (SynIdentifier *)pTVar13;
      pAVar3[uVar11].source = pSVar23;
      *(undefined8 *)&pAVar3[uVar11].isExplicit = uVar8;
      uVar35 = uVar35 + 1;
      lVar33 = lVar33 + 0x30;
    } while (uVar35 < (uint)local_1c8._8_4_);
  }
  if (pTVar17->returnType == ctx->typeAuto) {
    pFVar20 = (FunctionData *)0x0;
  }
  else {
    pFVar20 = anon_unknown.dwarf_9c70f::ImplementPrototype(ctx,this);
    if (pFVar20 == (FunctionData *)0x0) {
      pFVar20 = (FunctionData *)0x0;
    }
    else {
      if (prototype) {
        pcVar34 = "ERROR: function is already defined";
LAB_00164c2d:
        anon_unknown.dwarf_9c70f::Stop(ctx,&source_00->super_SynBase,pcVar34);
      }
      if (coroutine) {
        if (pFVar20->coroutine == false) {
          pcVar34 = "ERROR: function prototype was not a coroutine";
          goto LAB_00164c2d;
        }
      }
      else if (pFVar20->coroutine != false) {
        pcVar34 = "ERROR: function prototype was a coroutine";
        goto LAB_00164c2d;
      }
      this->contextType = pFVar20->contextType;
      uVar11 = (this->arguments).count;
      if (uVar11 != 0) {
        lVar33 = 0x20;
        uVar35 = 0;
        do {
          if ((pFVar20->arguments).count <= uVar35) {
            __assert_fail("index < count",
                          "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/Array.h"
                          ,0x199,
                          "T &SmallArray<ArgumentData, 4>::operator[](unsigned int) [T = ArgumentData, N = 4]"
                         );
          }
          lVar2 = *(long *)((long)&((pFVar20->arguments).data)->source + lVar33);
          if (lVar2 != 0) {
            pAVar3 = (this->arguments).data;
            if (*(long *)((long)&pAVar3->source + lVar33) == 0) {
              *(long *)((long)&pAVar3->source + lVar33) = lVar2;
            }
            else {
              anon_unknown.dwarf_9c70f::Report
                        (ctx,&source_00->super_SynBase,
                         "ERROR: function prototype already has a default value for argument #%d",
                         (ulong)((int)uVar35 + 1));
              uVar11 = (this->arguments).count;
            }
          }
          uVar35 = uVar35 + 1;
          lVar33 = lVar33 + 0x30;
        } while (uVar35 < uVar11);
      }
    }
  }
  IVar42.end = pcVar34;
  IVar42.begin = (this->name->name).end;
  anon_unknown.dwarf_9c70f::CheckFunctionConflict
            ((anon_unknown_dwarf_9c70f *)ctx,(ExpressionContext *)source,
             (SynBase *)(this->name->name).begin,IVar42);
  this_01 = ctx;
  ExpressionContext::AddFunction(ctx,this);
  bVar10 = ExpressionContext::IsGenericFunction(this_01,this);
  if (bVar10) {
    if (instance != (TypeFunction *)0x0) {
      __assert_fail("!instance",
                    "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/ExpressionTree.cpp"
                    ,0x23af,
                    "ExprBase *CreateFunctionDefinition(ExpressionContext &, SynBase *, bool, bool, TypeBase *, bool, TypeBase *, bool, SynIdentifier *, IntrusiveList<SynIdentifier>, IntrusiveList<SynFunctionArgument>, IntrusiveList<SynBase>, FunctionData *, TypeFunction *, IntrusiveList<MatchData>)"
                   );
    }
    if (prototype) {
      anon_unknown.dwarf_9c70f::Stop
                (ctx,&source_00->super_SynBase,"ERROR: generic function cannot be forward-declared")
      ;
    }
    if (bVar9) {
      ExpressionContext::PopScope(ctx,SCOPE_TYPE,true);
    }
    if ((source == (SynBase *)0x0) || (source->typeID != 0x37)) {
      __assert_fail("isType<SynFunctionDefinition>(source)",
                    "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/ExpressionTree.cpp"
                    ,0x23b7,
                    "ExprBase *CreateFunctionDefinition(ExpressionContext &, SynBase *, bool, bool, TypeBase *, bool, TypeBase *, bool, SynIdentifier *, IntrusiveList<SynIdentifier>, IntrusiveList<SynFunctionArgument>, IntrusiveList<SynBase>, FunctionData *, TypeFunction *, IntrusiveList<MatchData>)"
                   );
    }
    this->definition = (SynFunctionDefinition *)source;
    iVar12 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x48);
    pEVar26 = (ExprBase *)CONCAT44(extraout_var_04,iVar12);
    pTVar17 = this->type;
    pEVar26->typeID = 0x25;
    pEVar26->source = source;
    pEVar26->type = &pTVar17->super_TypeBase;
    pEVar26->next = (ExprBase *)0x0;
    pEVar26->listed = false;
    pEVar26->_vptr_ExprBase = (_func_int **)&PTR__ExprBase_002240e8;
    pEVar26[1]._vptr_ExprBase = (_func_int **)this;
    *(undefined8 *)&pEVar26[1].typeID = 0;
    pEVar26[1].source = (SynBase *)0x0;
    this->declaration = pEVar26;
    if (((pTVar21 == (TypeBase *)0x0) || (pTVar21->typeID != 0x18)) ||
       (pcVar34 = strstr((this->name->name).begin,"::"), pcVar34 == (char *)0x0)) goto LAB_00164942;
    uVar11 = *(uint *)&pTVar21[3].name.end;
    if (uVar11 == *(uint *)((long)&pTVar21[3].name.end + 4)) {
      SmallArray<FunctionData_*,_4U>::grow
                ((SmallArray<FunctionData_*,_4U> *)&pTVar21[3].name,uVar11);
    }
    pcVar4 = pTVar21[3].name.begin;
    if (pcVar4 != (char *)0x0) {
      uVar11 = *(uint *)&pTVar21[3].name.end;
      *(uint *)&pTVar21[3].name.end = uVar11 + 1;
      *(FunctionData **)(pcVar4 + (ulong)uVar11 * 8) = this;
      sVar22 = strlen(pcVar34 + 2);
      uVar11 = NULLC::GetStringHash(pcVar34 + 2,pcVar34 + sVar22 + 2);
      DirectChainedMap<FunctionData_*>::insert
                ((DirectChainedMap<FunctionData_*> *)&pTVar21[3].arrayTypes,uVar11,this);
      pEVar26 = this->declaration;
      goto LAB_00164942;
    }
LAB_00164c3c:
    pcVar34 = "void SmallArray<FunctionData *, 4>::push_back(const T &) [T = FunctionData *, N = 4]"
    ;
    goto LAB_00164a38;
  }
  if (isOperator) {
    pSVar37 = *(ScopeData **)local_280;
    if ((pSVar37->type | SCOPE_FUNCTION) == SCOPE_TYPE) {
      pSVar37 = ctx->globalScope;
    }
    DirectChainedMap<IdentifierLookupResult>::remove
              (&pSVar37->idLookupMap,(char *)(ulong)this->nameHash);
  }
  if (genericProto != (FunctionData *)0x0) {
    this->proto = genericProto;
    uVar11 = (genericProto->instances).count;
    if (uVar11 == (genericProto->instances).max) {
      SmallArray<FunctionData_*,_8U>::grow(&genericProto->instances,uVar11);
    }
    ppFVar5 = (genericProto->instances).data;
    if (ppFVar5 == (FunctionData **)0x0) {
      pcVar34 = 
      "void SmallArray<FunctionData *, 8>::push_back(const T &) [T = FunctionData *, N = 8]";
      goto LAB_00164a38;
    }
    uVar11 = (genericProto->instances).count;
    (genericProto->instances).count = uVar11 + 1;
    ppFVar5[uVar11] = this;
  }
  ExpressionContext::PushScope(ctx,this);
  this->functionScope = *(ScopeData **)local_280;
  for (pMVar15 = (this->aliases).head; pMVar15 != (MatchData *)0x0; pMVar15 = pMVar15->next) {
    iVar12 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x30);
    alias = (AliasData *)CONCAT44(extraout_var_05,iVar12);
    pSVar37 = ctx->scope;
    pSVar19 = pMVar15->name;
    pTVar13 = pMVar15->type;
    uVar11 = ctx->uniqueAliasId;
    ctx->uniqueAliasId = uVar11 + 1;
    alias->source = source;
    alias->scope = pSVar37;
    alias->type = pTVar13;
    alias->name = pSVar19;
    alias->uniqueId = uVar11;
    alias->importModule = (ModuleData *)0x0;
    uVar11 = NULLC::GetStringHash((pSVar19->name).begin,(pSVar19->name).end);
    alias->nameHash = uVar11;
    ExpressionContext::AddAlias(ctx,alias);
  }
  local_1d8.head = (ExprVariableDefinition *)0x0;
  local_1d8.tail = (ExprVariableDefinition *)0x0;
  arguments_02.count = local_1c8._8_4_;
  arguments_02.data = (ArgumentData *)local_1c8._0_8_;
  arguments_02._12_4_ = 0;
  CreateFunctionArgumentVariables(ctx,source,this,arguments_02,&local_1d8);
  pSVar23 = &ExpressionContext::MakeInternal(ctx,source)->super_SynBase;
  pEVar24 = CreateFunctionContextArgument(ctx,pSVar23,this);
  this->argumentsSize = this->functionScope->dataSize;
  local_228.head = (ExprBase *)0x0;
  local_228.tail = (ExprBase *)0x0;
  if (prototype) {
    if (this->type->returnType == ctx->typeAuto) {
      anon_unknown.dwarf_9c70f::Stop
                (ctx,&source_00->super_SynBase,
                 "ERROR: function prototype with unresolved return type");
    }
    this->isPrototype = true;
    local_268 = (ExprBase *)0x0;
  }
  else {
    if (this->coroutine == true) {
      uVar40 = anon_unknown.dwarf_9c70f::AllocateVariableInScope
                         (ctx,source,ctx->typeInt->alignment,ctx->typeInt);
      iVar12 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x50);
      pSVar19 = (SynIdentifier *)CONCAT44(extraout_var_06,iVar12);
      (pSVar19->super_SynBase).typeID = 4;
      (pSVar19->super_SynBase).begin = (Lexeme *)0x0;
      (pSVar19->super_SynBase).end = (Lexeme *)0x0;
      (pSVar19->super_SynBase).pos.begin = (char *)0x0;
      (pSVar19->super_SynBase).pos.end = (char *)0x0;
      *(undefined8 *)((long)&(pSVar19->super_SynBase).pos.end + 2) = 0;
      *(undefined8 *)((long)&(pSVar19->super_SynBase).next + 2) = 0;
      (pSVar19->super_SynBase)._vptr_SynBase = (_func_int **)&PTR__SynBase_002222c0;
      (pSVar19->name).begin = "$jmpOffset";
      (pSVar19->name).end = "";
      iVar12 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x170);
      this_00 = (VariableData *)CONCAT44(extraout_var_07,iVar12);
      uVar11 = ctx->uniqueVariableId;
      ctx->uniqueVariableId = uVar11 + 1;
      VariableData::VariableData
                (this_00,ctx->allocator,source,ctx->scope,0,ctx->typeInt,pSVar19,uVar40,uVar11);
      this->coroutineJumpOffset = this_00;
      bVar10 = anon_unknown.dwarf_9c70f::IsLookupOnlyVariable
                         (*(ExpressionContext **)local_280,this_00);
      if (bVar10) {
        this_00->lookupOnly = true;
      }
      ExpressionContext::AddVariable(ctx,this_00,false);
      AddFunctionCoroutineVariable(ctx,source,this,this->coroutineJumpOffset);
      local_268 = CreateVariableAccess(ctx,source,this->coroutineJumpOffset,true);
    }
    else {
      local_268 = (ExprBase *)0x0;
    }
    classType = (TypeClass *)this->scope->ownerType;
    if ((classType != (TypeClass *)0x0) &&
       ((classType->super_TypeStruct).super_TypeBase.typeID == 0x18)) {
      pTVar25 = (TypeClass *)classType->proto;
      if ((TypeClass *)classType->proto == (TypeClass *)0x0) {
        pTVar25 = classType;
      }
      local_258.node = (Node)GetTypeConstructorName((pTVar25->super_TypeStruct).super_TypeBase.name)
      ;
      bVar10 = InplaceStr::operator==((InplaceStr *)&local_258,local_230);
      if (bVar10) {
        CreateDefaultConstructorCode(ctx,source,classType,&local_228);
      }
    }
    if (expressions.head != (SynBase *)0x0) {
      do {
        pEVar26 = AnalyzeStatement(ctx,expressions.head);
        IntrusiveList<ExprBase>::push_back(&local_228,pEVar26);
        expressions.head = (expressions.head)->next;
      } while (expressions.head != (SynBase *)0x0);
    }
    pTVar13 = this->type->returnType;
    if (pTVar13 == ctx->typeAuto) {
      pTVar17 = ExpressionContext::GetFunctionType(ctx,source,ctx->typeVoid,this->type->arguments);
      this->type = pTVar17;
      pTVar13 = pTVar17->returnType;
    }
    pTVar31 = ctx->typeVoid;
    if (pTVar13 != pTVar31) {
      if (this->hasExplicitReturn == false) {
        anon_unknown.dwarf_9c70f::Report
                  (ctx,&source_00->super_SynBase,
                   "ERROR: function must return a value of type \'%.*s\'",
                   (ulong)(uint)(*(int *)&(returnType->name).end - (int)(returnType->name).begin));
        pTVar13 = this->type->returnType;
        pTVar31 = ctx->typeVoid;
      }
      if (pTVar13 != pTVar31) goto LAB_0016428b;
    }
    pSVar23 = &ExpressionContext::MakeInternal(ctx,source)->super_SynBase;
    iVar12 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x48);
    pEVar26 = (ExprBase *)CONCAT44(extraout_var_08,iVar12);
    local_238 = ctx->typeVoid;
    iVar12 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x30);
    pp_Var27 = (_func_int **)CONCAT44(extraout_var_09,iVar12);
    pTVar13 = ctx->typeVoid;
    *(undefined4 *)(pp_Var27 + 1) = 2;
    pp_Var27[2] = (_func_int *)pSVar23;
    pp_Var27[3] = (_func_int *)pTVar13;
    pp_Var27[4] = (_func_int *)0x0;
    *(undefined1 *)(pp_Var27 + 5) = 0;
    *pp_Var27 = (_func_int *)&PTR__ExprBase_00223698;
    local_240 = (TypeRef *)CreateFunctionCoroutineStateUpdate(ctx,pSVar23,this,0);
    pSVar28 = &ExpressionContext::MakeInternal(ctx,pSVar23)->super_SynBase;
    pSVar28 = (SynBase *)CreateFunctionUpvalueClose(ctx,pSVar28,this,ctx->scope);
    pEVar26->typeID = 0x1c;
    pEVar26->source = pSVar23;
    pEVar26->type = local_238;
    pEVar26->next = (ExprBase *)0x0;
    pEVar26->listed = false;
    pEVar26->_vptr_ExprBase = (_func_int **)&PTR__ExprBase_00223b70;
    pEVar26[1]._vptr_ExprBase = pp_Var27;
    *(TypeRef **)&pEVar26[1].typeID = local_240;
    pEVar26[1].source = pSVar28;
    IntrusiveList<ExprBase>::push_back(&local_228,pEVar26);
  }
LAB_0016428b:
  ClosePendingUpvalues(ctx,this);
  ExpressionContext::PopScope(ctx,SCOPE_FUNCTION,true);
  if (bVar9) {
    ExpressionContext::PopScope(ctx,SCOPE_TYPE,true);
  }
  if (pTVar21 == (TypeBase *)0x0) {
    if ((!coroutine) &&
       ((ctx->scope == ctx->globalScope || (ctx->scope->ownerNamespace != (NamespaceData *)0x0))))
    goto LAB_001643bc;
    if (prototype) {
      pTVar21 = this->contextType;
      if ((pTVar21 == (TypeBase *)0x0) || (pTVar21->typeID != 0x12)) {
        __assert_fail("refType",
                      "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/ExpressionTree.cpp"
                      ,0x244c,
                      "ExprBase *CreateFunctionDefinition(ExpressionContext &, SynBase *, bool, bool, TypeBase *, bool, TypeBase *, bool, SynIdentifier *, IntrusiveList<SynIdentifier>, IntrusiveList<SynFunctionArgument>, IntrusiveList<SynBase>, FunctionData *, TypeFunction *, IntrusiveList<MatchData>)"
                     );
      }
      iVar12 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x50);
      pSVar19 = (SynIdentifier *)CONCAT44(extraout_var_10,iVar12);
      IVar42 = GetFunctionContextVariableName(ctx,this,this->functionIndex);
      (pSVar19->super_SynBase).typeID = 4;
      (pSVar19->super_SynBase).begin = (Lexeme *)0x0;
      (pSVar19->super_SynBase).end = (Lexeme *)0x0;
      (pSVar19->super_SynBase).pos.begin = (char *)0x0;
      (pSVar19->super_SynBase).pos.end = (char *)0x0;
      *(undefined8 *)((long)&(pSVar19->super_SynBase).pos.end + 2) = 0;
      *(undefined8 *)((long)&(pSVar19->super_SynBase).next + 2) = 0;
      (pSVar19->super_SynBase)._vptr_SynBase = (_func_int **)&PTR__SynBase_002222c0;
      pSVar19->name = IVar42;
      iVar12 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x170);
      local_298 = (VariableData *)CONCAT44(extraout_var_11,iVar12);
      uVar11 = pTVar21->alignment;
      uVar40 = ctx->uniqueVariableId;
      ctx->uniqueVariableId = uVar40 + 1;
      VariableData::VariableData
                (local_298,ctx->allocator,source,ctx->scope,uVar11,pTVar21,pSVar19,0,uVar40);
      local_298->isAlloca = true;
      local_298->offset = 0xffffffff;
      ExpressionContext::AddVariable(ctx,local_298,true);
      iVar12 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x40);
      pEVar30 = (ExprVariableDefinition *)CONCAT44(extraout_var_12,iVar12);
      pTVar21 = ctx->typeVoid;
      iVar12 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x20);
      pVVar29 = (VariableHandle *)CONCAT44(extraout_var_13,iVar12);
      pVVar29->source = (SynBase *)0x0;
      pVVar29->variable = local_298;
      pVVar29->next = (VariableHandle *)0x0;
      pVVar29->listed = false;
      (pEVar30->super_ExprBase).typeID = 0x1e;
      (pEVar30->super_ExprBase).source = source;
      (pEVar30->super_ExprBase).type = pTVar21;
      (pEVar30->super_ExprBase).next = (ExprBase *)0x0;
      (pEVar30->super_ExprBase).listed = false;
      (pEVar30->super_ExprBase)._vptr_ExprBase = (_func_int **)&PTR__ExprBase_00223a58;
      pEVar30->variable = pVVar29;
      pEVar30->initializer = (ExprBase *)0x0;
    }
    else {
      local_298 = CreateFunctionContextVariable(ctx,source,this,pFVar20);
      pEVar30 = CreateFunctionContextVariableDefinition(ctx,source,this,pFVar20,local_298);
    }
  }
  else {
    local_258.node = *(Node *)&pTVar21->name;
    if (pTVar21->typeID == 0x18) {
      if (*(long *)&pTVar21[2].typeIndex != 0) {
        local_258.node = *(Node *)(*(long *)&pTVar21[2].typeIndex + 0x10);
      }
      pcVar34 = strstr((this->name->name).begin,"::");
      if (pcVar34 != (char *)0x0) {
        uVar11 = *(uint *)&pTVar21[3].name.end;
        if (uVar11 == *(uint *)((long)&pTVar21[3].name.end + 4)) {
          SmallArray<FunctionData_*,_4U>::grow
                    ((SmallArray<FunctionData_*,_4U> *)&pTVar21[3].name,uVar11);
        }
        pcVar4 = pTVar21[3].name.begin;
        if (pcVar4 == (char *)0x0) goto LAB_00164c3c;
        uVar11 = *(uint *)&pTVar21[3].name.end;
        *(uint *)&pTVar21[3].name.end = uVar11 + 1;
        *(FunctionData **)(pcVar4 + (ulong)uVar11 * 8) = this;
        sVar22 = strlen(pcVar34 + 2);
        uVar11 = NULLC::GetStringHash(pcVar34 + 2,pcVar34 + sVar22 + 2);
        DirectChainedMap<FunctionData_*>::insert
                  ((DirectChainedMap<FunctionData_*> *)&pTVar21[3].arrayTypes,uVar11,this);
      }
    }
    bVar9 = InplaceStr::operator==(local_230,(InplaceStr *)&local_258);
    if ((bVar9) && (this->type->returnType != ctx->typeVoid)) {
      anon_unknown.dwarf_9c70f::Stop
                (ctx,&source_00->super_SynBase,
                 "ERROR: type constructor return type must be \'void\'");
    }
LAB_001643bc:
    local_298 = (VariableData *)0x0;
    pEVar30 = (ExprVariableDefinition *)0x0;
  }
  pFVar20 = anon_unknown.dwarf_9c70f::ImplementPrototype(ctx,this);
  if (pFVar20 != (FunctionData *)0x0) {
    pTVar21 = this->contextType;
    if ((pTVar21 == (TypeBase *)0x0) || (pTVar21->typeID != 0x12)) {
      __assert_fail("refType",
                    "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/ExpressionTree.cpp"
                    ,0x2466,
                    "ExprBase *CreateFunctionDefinition(ExpressionContext &, SynBase *, bool, bool, TypeBase *, bool, TypeBase *, bool, SynIdentifier *, IntrusiveList<SynIdentifier>, IntrusiveList<SynFunctionArgument>, IntrusiveList<SynBase>, FunctionData *, TypeFunction *, IntrusiveList<MatchData>)"
                   );
    }
    pTVar21 = (TypeBase *)pTVar21[1]._vptr_TypeBase;
    if (pTVar21 != ctx->typeVoid) {
      if ((pTVar21 == (TypeBase *)0x0) || (pTVar21->typeID != 0x18)) {
        __assert_fail("classType",
                      "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/ExpressionTree.cpp"
                      ,0x246c,
                      "ExprBase *CreateFunctionDefinition(ExpressionContext &, SynBase *, bool, bool, TypeBase *, bool, TypeBase *, bool, SynIdentifier *, IntrusiveList<SynIdentifier>, IntrusiveList<SynFunctionArgument>, IntrusiveList<SynBase>, FunctionData *, TypeFunction *, IntrusiveList<MatchData>)"
                     );
      }
      lVar33._0_4_ = pTVar21[1].typeID;
      lVar33._4_4_ = pTVar21[1].nameHash;
      if (lVar33 != 0) {
        anon_unknown.dwarf_9c70f::Report
                  (ctx,&source_00->super_SynBase,
                   "ERROR: function \'%.*s\' is being defined with the same set of arguments",
                   (ulong)(uint)(*(int *)&(this->name->name).end - (int)(this->name->name).begin));
      }
    }
  }
  if (isOperator) {
    pSVar37 = *(ScopeData **)local_280;
    if ((pSVar37->type | SCOPE_FUNCTION) == SCOPE_TYPE) {
      pSVar37 = ctx->globalScope;
      uVar11 = NULLC::GetStringHash((this->name->name).begin,(this->name->name).end);
    }
    else {
      uVar11 = this->nameHash;
    }
    auVar7._8_8_ = 0;
    auVar7._0_8_ = this;
    DirectChainedMap<IdentifierLookupResult>::insert
              (&pSVar37->idLookupMap,uVar11,(IdentifierLookupResult)(auVar7 << 0x40));
    (ctx->noAssignmentOperatorForTypePair).count = 0;
    NULLC::fillMemory((ctx->noAssignmentOperatorForTypePair).data,0,
                      (ulong)(ctx->noAssignmentOperatorForTypePair).bucketCount << 4);
    (ctx->noIndexOperatorForTypePair).count = 0;
    NULLC::fillMemory((ctx->noIndexOperatorForTypePair).data,0,
                      (ulong)(ctx->noIndexOperatorForTypePair).bucketCount << 4);
    lVar33 = 0;
    do {
      *(undefined4 *)((long)(ctx->noUnaryOperatorForTypePair).data[0].storage + lVar33 + -0xc) = 0;
      NULLC::fillMemory(*(void **)((long)(ctx->noUnaryOperatorForTypePair).data[0].storage +
                                  lVar33 + -8),0,
                        (ulong)*(uint *)((long)(ctx->noUnaryOperatorForTypePair).data[0].storage +
                                        lVar33 + -0x10) << 3);
      lVar33 = lVar33 + 0x38;
    } while (lVar33 != 0xe0);
    lVar33 = 0;
    do {
      *(undefined4 *)((long)(ctx->noBinaryOperatorForTypePair).data[0].storage + lVar33 + -0xc) = 0;
      NULLC::fillMemory(*(void **)((long)(ctx->noBinaryOperatorForTypePair).data[0].storage +
                                  lVar33 + -8),0,
                        (ulong)*(uint *)((long)&((SmallDenseSet<TypePair,_TypePairHasher,_4U> *)
                                                ((ctx->noBinaryOperatorForTypePair).data[0].storage
                                                + -1))->bucketCount + lVar33) << 4);
      lVar33 = lVar33 + 0x58;
    } while (lVar33 != 0x738);
    lVar33 = 0;
    do {
      *(undefined4 *)((long)(ctx->noModifyOperatorForTypePair).data[0].storage + lVar33 + -0xc) = 0;
      NULLC::fillMemory(*(void **)((long)(ctx->noModifyOperatorForTypePair).data[0].storage +
                                  lVar33 + -8),0,
                        (ulong)*(uint *)((long)&((SmallDenseSet<TypePair,_TypePairHasher,_4U> *)
                                                ((ctx->noModifyOperatorForTypePair).data[0].storage
                                                + -1))->bucketCount + lVar33) << 4);
      lVar33 = lVar33 + 0x58;
    } while (lVar33 != 0x3c8);
  }
  uVar11 = NULLC::GetStringHash((this->name->name).begin,(this->name->name).end);
  do {
    local_280 = local_280->scope;
    if (local_280 == (ScopeData *)0x0) goto LAB_0016485a;
    IVar42 = (InplaceStr)
             DirectChainedMap<IdentifierLookupResult>::first(&local_280->idLookupMap,uVar11);
    pTVar21 = (TypeBase *)IVar42.end;
  } while (pTVar21 == (TypeBase *)0x0);
  if ((pTVar21->name).begin != (char *)0x0) {
    local_258.node = (Node)IVar42;
    local_258.scope = local_280;
    do {
      pFVar20 = (FunctionData *)(pTVar21->name).begin;
      if (pFVar20 == (FunctionData *)0x0 || pFVar20 == this) {
        anon_unknown.dwarf_9c70f::FunctionLookupChain::next(&local_218,&local_258);
      }
      else {
        pMVar15 = (pFVar20->generics).head;
        iVar12 = 0;
        iVar36 = 0;
        if (pMVar15 != (MatchData *)0x0) {
          iVar36 = 0;
          pMVar32 = pMVar15;
          do {
            iVar36 = iVar36 + 1;
            pMVar32 = pMVar32->next;
          } while (pMVar32 != (MatchData *)0x0);
        }
        pMVar32 = (this->generics).head;
        if (pMVar32 != (MatchData *)0x0) {
          iVar12 = 0;
          pMVar38 = pMVar32;
          do {
            iVar12 = iVar12 + 1;
            pMVar38 = pMVar38->next;
          } while (pMVar38 != (MatchData *)0x0);
        }
        if (iVar36 == iVar12) {
          if (pMVar15 != (MatchData *)0x0) {
            for (; pMVar32 != (MatchData *)0x0; pMVar32 = pMVar32->next) {
              if (pMVar15->type != pMVar32->type) goto LAB_0016481e;
              pMVar15 = pMVar15->next;
              if (pMVar15 == (MatchData *)0x0) break;
            }
          }
          if ((pFVar20->type == this->type) && (pFVar20->scope->ownerType == this->scope->ownerType)
             ) {
            anon_unknown.dwarf_9c70f::Report
                      (ctx,&source_00->super_SynBase,
                       "ERROR: function \'%.*s\' is being defined with the same set of arguments",
                       (ulong)(uint)(*(int *)&(this->name->name).end - (int)(this->name->name).begin
                                    ));
            pcVar34 = ctx->errorBuf;
            sVar22 = strlen(pcVar34);
            pcVar34 = pcVar34 + sVar22;
            iVar12 = NULLC::SafeSprintf(pcVar34,(ulong)(ctx->errorBufSize - (int)sVar22),
                                        "previous definition here");
            anon_unknown.dwarf_9c70f::AddRelatedErrorInfoWithLocation
                      (ctx,pFVar20->source,pcVar34,pcVar34 + iVar12);
            break;
          }
        }
LAB_0016481e:
        anon_unknown.dwarf_9c70f::FunctionLookupChain::next(&local_218,&local_258);
      }
      local_258.scope = local_218.scope;
      local_258.node.node = local_218.node.node;
      local_258.node.start = local_218.node.start;
      pTVar21 = (TypeBase *)local_218.node.node;
    } while ((TypeBase *)local_218.node.node != (TypeBase *)0x0);
  }
LAB_0016485a:
  iVar12 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x78);
  pEVar26 = (ExprBase *)CONCAT44(extraout_var_14,iVar12);
  pTVar17 = this->type;
  local_218.node.start = (Node *)local_1d8.head;
  local_218.node.node = (Node *)local_1d8.tail;
  local_258.node.node = (Node *)local_228.tail;
  local_258.node.start = (Node *)local_228.head;
  pEVar26->typeID = 0x24;
  pEVar26->source = source;
  pEVar26->type = &pTVar17->super_TypeBase;
  pEVar26->next = (ExprBase *)0x0;
  pEVar26->listed = false;
  pEVar26->_vptr_ExprBase = (_func_int **)&PTR__ExprBase_00223ba8;
  pEVar26[1]._vptr_ExprBase = (_func_int **)this;
  *(ExprVariableDefinition **)&pEVar26[1].typeID = pEVar24;
  pEVar26[1].source = (SynBase *)local_1d8.head;
  pEVar26[1].type = (TypeBase *)local_1d8.tail;
  pEVar26[1].next = local_268;
  *(ExprBase **)&pEVar26[1].listed = local_228.head;
  pEVar26[2]._vptr_ExprBase = (_func_int **)local_228.tail;
  *(ExprVariableDefinition **)&pEVar26[2].typeID = pEVar30;
  pEVar26[2].source = (SynBase *)local_298;
  this->declaration = pEVar26;
  uVar11 = (ctx->definitions).count;
  if (uVar11 == (ctx->definitions).max) {
    SmallArray<ExprBase_*,_128U>::grow(&ctx->definitions,uVar11);
  }
  ppEVar6 = (ctx->definitions).data;
  if (ppEVar6 != (ExprBase **)0x0) {
    pEVar26 = this->declaration;
    uVar11 = (ctx->definitions).count;
    (ctx->definitions).count = uVar11 + 1;
    ppEVar6[uVar11] = pEVar26;
LAB_00164942:
    NULLC::TraceScope::~TraceScope(&local_1e8);
    SmallArray<ArgumentData,_8U>::~SmallArray((SmallArray<ArgumentData,_8U> *)local_1c8);
    return pEVar26;
  }
  pcVar34 = "void SmallArray<ExprBase *, 128>::push_back(const T &) [T = ExprBase *, N = 128]";
LAB_00164a38:
  __assert_fail("data",
                "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/Array.h",
                0x162,pcVar34);
}

Assistant:

ExprBase* CreateFunctionDefinition(ExpressionContext &ctx, SynBase *source, bool prototype, bool coroutine, TypeBase *parentType, bool accessor, TypeBase *returnType, bool isOperator, SynIdentifier *name, IntrusiveList<SynIdentifier> aliases, IntrusiveList<SynFunctionArgument> arguments, IntrusiveList<SynBase> expressions, FunctionData *genericProto, TypeFunction *instance, IntrusiveList<MatchData> matches)
{
	SynBase *errorLocation = name->begin ? name : source;

	bool addedParentScope = RestoreParentTypeScope(ctx, source, parentType);

	if(ctx.scope->ownerType && !parentType)
		parentType = ctx.scope->ownerType;

	if(parentType && coroutine)
		Stop(ctx, errorLocation, "ERROR: coroutine cannot be a member function");

	IntrusiveList<MatchData> generics;

	for(SynIdentifier *curr = aliases.head; curr; curr = getType<SynIdentifier>(curr->next))
	{
		if(LookupTypeByName(ctx, curr->name.hash()))
			Stop(ctx, curr, "ERROR: there is already a type with the same name");

		for(SynIdentifier *prev = aliases.head; prev && prev != curr; prev = getType<SynIdentifier>(prev->next))
		{
			if(prev->name == curr->name)
				Stop(ctx, curr, "ERROR: there is already an alias with the same name");
		}

		TypeBase *target = NULL;

		for(MatchData *match = matches.head; match; match = match->next)
		{
			if(curr->name == match->name->name)
			{
				target = match->type;
				break;
			}
		}

		if(!target)
			target = ctx.GetGenericAliasType(curr);

		generics.push_back(new (ctx.get<MatchData>()) MatchData(curr, target));
	}

	SmallArray<ArgumentData, 8> argData(ctx.allocator);

	AnalyzeFunctionDefinitionArguments(ctx, arguments, parentType, instance, argData);

	// Check required operator properties
	if(isOperator)
		CheckOperatorName(ctx, source, name->name, argData);

	if(accessor && name->name == parentType->name)
		Stop(ctx, errorLocation, "ERROR: name '%.*s' is already taken for a type", FMT_ISTR(name->name));

	InplaceStr functionName = GetFunctionName(ctx, ctx.scope, parentType, name->name, isOperator, accessor);

	TRACE_SCOPE("analyze", "CreateFunctionDefinition");
	TRACE_LABEL2(functionName.begin, functionName.end);

	TypeBase *contextRefType = NULL;

	if(parentType)
		contextRefType = ctx.GetReferenceType(parentType);
	else if(!coroutine && (ctx.scope == ctx.globalScope || ctx.scope->ownerNamespace))
		contextRefType = ctx.GetReferenceType(ctx.typeVoid);
	else
		contextRefType = ctx.GetReferenceType(CreateFunctionContextType(ctx, source, functionName));

	if(isType<TypeError>(returnType))
	{
		if(addedParentScope)
			ctx.PopScope(SCOPE_TYPE);

		return new (ctx.get<ExprError>()) ExprError(source, ctx.GetErrorType());
	}

	for(unsigned i = 0; i < argData.size(); i++)
	{
		if(isType<TypeError>(argData[i].type))
		{
			if(addedParentScope)
				ctx.PopScope(SCOPE_TYPE);

			return new (ctx.get<ExprError>()) ExprError(source, ctx.GetErrorType());
		}
	}

	TypeFunction *functionType = ctx.GetFunctionType(source, returnType, argData);

	if(instance)
		assert(functionType == instance);

	if(VariableData *variable = LookupVariableByName(ctx, functionName.hash()))
	{
		if(variable->scope == ctx.scope)
			Stop(ctx, errorLocation, "ERROR: name '%.*s' is already taken for a variable in current scope", FMT_ISTR(name->name));
	}

	if(TypeClass *classType = getType<TypeClass>(parentType))
	{
		if(name->name == InplaceStr("finalize"))
			classType->hasFinalizer = true;
	}

	SynIdentifier *nameIdentifier = new (ctx.get<SynIdentifier>()) SynIdentifier(name, functionName);

	FunctionData *function = new (ctx.get<FunctionData>()) FunctionData(ctx.allocator, source, ctx.scope, coroutine, accessor, isOperator, functionType, contextRefType, nameIdentifier, generics, ctx.uniqueFunctionId++);

	function->aliases = matches;

	// Fill in argument data
	for(unsigned i = 0; i < argData.size(); i++)
		function->arguments.push_back(argData[i]);

	FunctionData *implementedPrototype = NULL;

	// If the type is known, implement the prototype immediately
	if(functionType->returnType != ctx.typeAuto)
	{
		if(FunctionData *functionPrototype = ImplementPrototype(ctx, function))
		{
			if(prototype)
				Stop(ctx, errorLocation, "ERROR: function is already defined");

			if(coroutine && !functionPrototype->coroutine)
				Stop(ctx, errorLocation, "ERROR: function prototype was not a coroutine");

			if(!coroutine && functionPrototype->coroutine)
				Stop(ctx, errorLocation, "ERROR: function prototype was a coroutine");

			function->contextType = functionPrototype->contextType;

			// Assign default function arguments
			for(unsigned i = 0; i < function->arguments.size(); i++)
			{
				ArgumentData &protoArg = functionPrototype->arguments[i];
				ArgumentData &implArg = function->arguments[i];

				if(protoArg.value)
				{
					if(!implArg.value)
						implArg.value = protoArg.value;
					else
						Report(ctx, errorLocation, "ERROR: function prototype already has a default value for argument #%d", i + 1);
				}
			}

			implementedPrototype = functionPrototype;
		}
	}

	CheckFunctionConflict(ctx, source, function->name->name);

	ctx.AddFunction(function);

	if(ctx.IsGenericFunction(function))
	{
		assert(!instance);

		if(prototype)
			Stop(ctx, errorLocation, "ERROR: generic function cannot be forward-declared");

		if(addedParentScope)
			ctx.PopScope(SCOPE_TYPE);

		assert(isType<SynFunctionDefinition>(source));

		function->definition = getType<SynFunctionDefinition>(source);
		function->declaration = new (ctx.get<ExprGenericFunctionPrototype>()) ExprGenericFunctionPrototype(source, function->type, function);

		if(TypeClass *typeClass = getType<TypeClass>(parentType))
		{
			// Register type method
			if(const char *pos = strstr(function->name->name.begin, "::"))
			{
				typeClass->methods.push_back(function);
				typeClass->methodMap.insert(InplaceStr(pos + 2).hash(), function);
			}
		}

		return function->declaration;
	}

	// Operator overloads can't be called recursively and become available at the end of the definition
	if (isOperator)
	{
		if(ctx.scope->type == SCOPE_TYPE || ctx.scope->type == SCOPE_NAMESPACE)
			ctx.globalScope->idLookupMap.remove(function->nameHash, IdentifierLookupResult(function));
		else
			ctx.scope->idLookupMap.remove(function->nameHash, IdentifierLookupResult(function));
	}

	if(genericProto)
	{
		function->proto = genericProto;

		genericProto->instances.push_back(function);
	}

	ctx.PushScope(function);

	function->functionScope = ctx.scope;

	for(MatchData *curr = function->aliases.head; curr; curr = curr->next)
		ctx.AddAlias(new (ctx.get<AliasData>()) AliasData(source, ctx.scope, curr->type, curr->name, ctx.uniqueAliasId++));

	IntrusiveList<ExprVariableDefinition> variables;

	CreateFunctionArgumentVariables(ctx, source, function, argData, variables);

	ExprVariableDefinition *contextArgumentDefinition = CreateFunctionContextArgument(ctx, ctx.MakeInternal(source), function);

	function->argumentsSize = function->functionScope->dataSize;

	ExprBase *coroutineStateRead = NULL;

	IntrusiveList<ExprBase> code;

	if(prototype)
	{
		if(function->type->returnType == ctx.typeAuto)
			Stop(ctx, errorLocation, "ERROR: function prototype with unresolved return type");

		function->isPrototype = true;
	}
	else
	{
		if(function->coroutine)
		{
			unsigned offset = AllocateVariableInScope(ctx, source, ctx.typeInt->alignment, ctx.typeInt);

			SynIdentifier *nameIdentifier = new (ctx.get<SynIdentifier>()) SynIdentifier(InplaceStr("$jmpOffset"));

			function->coroutineJumpOffset = new (ctx.get<VariableData>()) VariableData(ctx.allocator, source, ctx.scope, 0, ctx.typeInt, nameIdentifier, offset, ctx.uniqueVariableId++);

			if (IsLookupOnlyVariable(ctx, function->coroutineJumpOffset))
				function->coroutineJumpOffset->lookupOnly = true;

			ctx.AddVariable(function->coroutineJumpOffset, false);

			AddFunctionCoroutineVariable(ctx, source, function, function->coroutineJumpOffset);

			coroutineStateRead = CreateVariableAccess(ctx, source, function->coroutineJumpOffset, true);
		}

		// If this is a custom default constructor, add a prolog
		if(TypeClass *classType = getType<TypeClass>(function->scope->ownerType))
		{
			if(GetTypeConstructorName(classType) == name->name)
				CreateDefaultConstructorCode(ctx, source, classType, code);
		}

		for(SynBase *expression = expressions.head; expression; expression = expression->next)
			code.push_back(AnalyzeStatement(ctx, expression));

		// If the function type is still auto it means that it hasn't returned anything
		if(function->type->returnType == ctx.typeAuto)
			function->type = ctx.GetFunctionType(source, ctx.typeVoid, function->type->arguments);

		if(function->type->returnType != ctx.typeVoid && !function->hasExplicitReturn)
			Report(ctx, errorLocation, "ERROR: function must return a value of type '%.*s'", FMT_ISTR(returnType->name));

		// User might have not returned from all control paths, for a void function we will generate a return
		if(function->type->returnType == ctx.typeVoid)
		{
			SynBase *location = ctx.MakeInternal(source);

			code.push_back(new (ctx.get<ExprReturn>()) ExprReturn(location, ctx.typeVoid, new (ctx.get<ExprVoid>()) ExprVoid(location, ctx.typeVoid), CreateFunctionCoroutineStateUpdate(ctx, location, function, 0), CreateFunctionUpvalueClose(ctx, ctx.MakeInternal(location), function, ctx.scope)));
		}
	}

	ClosePendingUpvalues(ctx, function);

	ctx.PopScope(SCOPE_FUNCTION);

	if(addedParentScope)
		ctx.PopScope(SCOPE_TYPE);

	if(parentType)
	{
		InplaceStr parentName = parentType->name;

		if(TypeClass *typeClass = getType<TypeClass>(parentType))
		{
			if(typeClass->proto)
				parentName = typeClass->proto->name;

			// Register type method
			if(const char *pos = strstr(function->name->name.begin, "::"))
			{
				typeClass->methods.push_back(function);
				typeClass->methodMap.insert(InplaceStr(pos + 2).hash(), function);
			}
		}

		if(name->name == parentName && function->type->returnType != ctx.typeVoid)
			Stop(ctx, errorLocation, "ERROR: type constructor return type must be 'void'");
	}

	VariableData *contextVariable = NULL;
	ExprVariableDefinition *contextVariableDefinition = NULL;

	if(parentType)
	{
		contextVariableDefinition = NULL;
	}
	else if(!coroutine && (ctx.scope == ctx.globalScope || ctx.scope->ownerNamespace))
	{
		contextVariableDefinition = NULL;
	}
	else if(prototype)
	{
		TypeRef *refType = getType<TypeRef>(function->contextType);

		assert(refType);

		SynIdentifier *nameIdentifier = new (ctx.get<SynIdentifier>()) SynIdentifier(GetFunctionContextVariableName(ctx, function, ctx.GetFunctionIndex(function)));

		contextVariable = new (ctx.get<VariableData>()) VariableData(ctx.allocator, source, ctx.scope, refType->alignment, refType, nameIdentifier, 0, ctx.uniqueVariableId++);

		contextVariable->isAlloca = true;
		contextVariable->offset = ~0u;

		//function->contextVariable = context;

		ctx.AddVariable(contextVariable, true);

		contextVariableDefinition = new (ctx.get<ExprVariableDefinition>()) ExprVariableDefinition(source, ctx.typeVoid, new (ctx.get<VariableHandle>()) VariableHandle(NULL, contextVariable), NULL);
	}
	else
	{
		contextVariable = CreateFunctionContextVariable(ctx, source, function, implementedPrototype);
		contextVariableDefinition = CreateFunctionContextVariableDefinition(ctx, source, function, implementedPrototype, contextVariable);
	}

	// If the type was deduced, implement prototype now that it's known
	if(ImplementPrototype(ctx, function))
	{
		TypeRef *refType = getType<TypeRef>(function->contextType);

		assert(refType);

		if(refType->subType != ctx.typeVoid)
		{
			TypeClass *classType = getType<TypeClass>(refType->subType);

			assert(classType);

			if(!classType->members.empty())
				Report(ctx, errorLocation, "ERROR: function '%.*s' is being defined with the same set of arguments", FMT_ISTR(function->name->name));
		}
	}

	// Time to make operator overload visible
	if(isOperator)
	{
		if(ctx.scope->type == SCOPE_TYPE || ctx.scope->type == SCOPE_NAMESPACE)
			ctx.globalScope->idLookupMap.insert(function->name->name.hash(), IdentifierLookupResult(function));
		else
			ctx.scope->idLookupMap.insert(function->nameHash, IdentifierLookupResult(function));

		// TODO: more precise invalidation
		ctx.noAssignmentOperatorForTypePair.clear();

		ctx.noIndexOperatorForTypePair.clear();

		for(unsigned i = 0; i < ctx.noUnaryOperatorForTypePair.size(); i++)
			ctx.noUnaryOperatorForTypePair[i].clear();

		for(unsigned i = 0; i < ctx.noBinaryOperatorForTypePair.size(); i++)
			ctx.noBinaryOperatorForTypePair[i].clear();

		for(unsigned i = 0; i < ctx.noModifyOperatorForTypePair.size(); i++)
			ctx.noModifyOperatorForTypePair[i].clear();
	}

	FunctionData *conflict = CheckUniqueness(ctx, function);

	if(conflict)
	{
		Report(ctx, errorLocation, "ERROR: function '%.*s' is being defined with the same set of arguments", FMT_ISTR(function->name->name));

		char *errorCurr = ctx.errorBuf + strlen(ctx.errorBuf);

		const char *messageStart = errorCurr;

		errorCurr += NULLC::SafeSprintf(errorCurr, ctx.errorBufSize - unsigned(errorCurr - ctx.errorBuf), "previous definition here");

		const char *messageEnd = errorCurr;

		AddRelatedErrorInfoWithLocation(ctx, conflict->source, messageStart, messageEnd);
	}

	function->declaration = new (ctx.get<ExprFunctionDefinition>()) ExprFunctionDefinition(source, function->type, function, contextArgumentDefinition, variables, coroutineStateRead, code, contextVariableDefinition, contextVariable);

	ctx.definitions.push_back(function->declaration);

	return function->declaration;
}